

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

shared_ptr<peg::Ope>
peg::seq<std::shared_ptr<peg::Ope>,peg::Definition&>(shared_ptr<peg::Ope> *args,Definition *args_1)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<peg::Ope> sVar2;
  undefined1 auStack_48 [32];
  undefined1 local_28 [24];
  
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 0x10),
             (__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> *)args_1);
  Definition::operator_cast_to_shared_ptr((Definition *)auStack_48);
  std::make_shared<peg::Sequence,std::shared_ptr<peg::Ope>,std::shared_ptr<peg::Ope>>
            ((shared_ptr<peg::Ope> *)local_28,(shared_ptr<peg::Ope> *)(auStack_48 + 0x10));
  uVar1 = local_28._8_8_;
  local_28._8_8_ = (void *)0x0;
  (args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)local_28._0_8_;
  (args->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
  local_28._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 0x18));
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)args;
  return (shared_ptr<peg::Ope>)sVar2.super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Ope> seq(Args&& ...args) {
    return std::make_shared<Sequence>(static_cast<std::shared_ptr<Ope>>(args)...);
}